

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O3

void __thiscall Board::draw(Board *this,RenderTarget *target,RenderStates states)

{
  VertexArray *this_00;
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  repr rVar4;
  bool bVar5;
  int iVar6;
  DebugScreen *pDVar7;
  Chunk *pCVar8;
  Vertex *pVVar9;
  long lVar10;
  string *this_01;
  int iVar11;
  ulong uVar12;
  int iVar13;
  RenderStates *pRVar14;
  undefined8 *puVar15;
  ulong uVar16;
  ulong uVar17;
  undefined8 *puVar18;
  int iVar19;
  size_t index;
  Color CVar20;
  byte bVar21;
  float fVar22;
  float fVar23;
  RenderStates states2;
  RenderStates in_stack_fffffffffffffe98;
  pointer local_d0;
  string local_c8;
  RenderTarget *local_a8;
  ulong local_a0;
  undefined8 local_98 [3];
  Transform local_80;
  
  bVar21 = 0;
  iVar6 = LodRenderer::getLevelOfDetail(&this->super_LodRenderer);
  sf::RenderTarget::draw
            (target,(Drawable *)(&(this->chunkRenderCache_).field_0x0 + (long)iVar6 * 0x2f8),&states
            );
  pRVar14 = &states;
  puVar15 = local_98;
  for (lVar10 = 0xd; lVar10 != 0; lVar10 = lVar10 + -1) {
    *puVar15 = *(undefined8 *)&pRVar14->blendMode;
    pRVar14 = (RenderStates *)((long)pRVar14 + (ulong)bVar21 * -0x10 + 8);
    puVar15 = puVar15 + (ulong)bVar21 * -2 + 1;
  }
  uVar1 = (this->lastVisibleArea_).left;
  uVar2 = (this->lastVisibleArea_).top;
  local_c8._M_dataplus._M_p =
       (pointer)CONCAT44((float)((uVar2 - (int)(this->lastTopLeft_ >> 0x20)) * 0x400),
                         (float)((uVar1 - (int)this->lastTopLeft_) * 0x400));
  sf::Transform::translate(&local_80,(Vector2f *)&local_c8);
  puVar15 = local_98;
  puVar18 = (undefined8 *)&stack0xfffffffffffffe98;
  for (lVar10 = 0xd; lVar10 != 0; lVar10 = lVar10 + -1) {
    *puVar18 = *puVar15;
    puVar15 = puVar15 + (ulong)bVar21 * -2 + 1;
    puVar18 = puVar18 + (ulong)bVar21 * -2 + 1;
  }
  local_a8 = target;
  LodRenderer::drawDecorations
            (&this->super_LodRenderer,target,in_stack_fffffffffffffe98,&this->lastVisibleArea_);
  pDVar7 = DebugScreen::instance();
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Board::draw draw_debug","");
  DebugScreen::profilerEvent(pDVar7,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  if (((this->debugDrawChunkBorder_ == true) && (iVar6 = (this->lastVisibleArea_).width, 0 < iVar6))
     && (iVar3 = (this->lastVisibleArea_).height, 0 < iVar3)) {
    this_00 = &this->debugChunkBorder_;
    sf::VertexArray::resize(this_00,(ulong)(uint)(iVar6 * iVar3 * 4));
    iVar6 = (this->lastVisibleArea_).height;
    if (0 < iVar6) {
      rVar4 = this->lastTopLeft_;
      local_a0 = (ulong)((this->lastVisibleArea_).top + ((uint)(rVar4 >> 0x20) ^ 0x7fffffff) + 1);
      iVar3 = (this->lastVisibleArea_).left;
      iVar11 = 0;
      index = 0;
      do {
        local_d0 = (this->chunkDrawables_).vec_.
                   super__Vector_base<std::pair<unsigned_long,_ChunkDrawable>,_std::allocator<std::pair<unsigned_long,_ChunkDrawable>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        uVar12 = (long)(this->chunkDrawables_).vec_.
                       super__Vector_base<std::pair<unsigned_long,_ChunkDrawable>,_std::allocator<std::pair<unsigned_long,_ChunkDrawable>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)local_d0;
        if (0 < (long)uVar12) {
          uVar12 = (uVar12 >> 5) * -0x5555555555555555;
          do {
            uVar16 = uVar12 >> 1;
            uVar17 = uVar16;
            if (local_d0[uVar16].first <=
                (CONCAT44((this->lastVisibleArea_).top + iVar11,(this->lastVisibleArea_).left + -1)
                | 0x8000000080000000)) {
              uVar17 = ~uVar16 + uVar12;
              local_d0 = local_d0 + uVar16 + 1;
            }
            uVar12 = uVar17;
          } while (0 < (long)uVar17);
        }
        if (0 < (this->lastVisibleArea_).width) {
          fVar22 = (float)(((int)local_a0 + iVar11) * 0x400);
          iVar13 = 0;
          iVar6 = (((uint)rVar4 ^ 0x7fffffff) + iVar3) * 0x400;
          do {
            iVar6 = iVar6 + 0x400;
            CVar20.r = '\0';
            CVar20.g = '\0';
            CVar20.b = 0xff;
            CVar20.a = 0xff;
            if ((local_d0 !=
                 (this->chunkDrawables_).vec_.
                 super__Vector_base<std::pair<unsigned_long,_ChunkDrawable>,_std::allocator<std::pair<unsigned_long,_ChunkDrawable>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish) &&
               (local_d0->first ==
                (CONCAT44((this->lastVisibleArea_).top + iVar11,
                          (this->lastVisibleArea_).left + iVar13) | 0x8000000080000000))) {
              pCVar8 = ChunkDrawable::getChunk(&local_d0->second);
              if (pCVar8 == (Chunk *)0x0) {
                CVar20.r = '\0';
                CVar20.g = 0xff;
                CVar20.b = 0xff;
                CVar20.a = 0xff;
              }
              else {
                pCVar8 = ChunkDrawable::getChunk(&local_d0->second);
                bVar5 = Chunk::isUnsaved(pCVar8);
                this_01 = (string *)&sf::Color::Yellow;
                if (bVar5) {
                  this_01 = &local_c8;
                  sf::Color::Color((Color *)this_01,0xff,'\x7f','\0',0xff);
                }
                CVar20 = *(Color *)&(this_01->_M_dataplus)._M_p;
              }
              local_d0 = local_d0 + 1;
            }
            fVar23 = (float)iVar6;
            iVar19 = (int)index;
            pVVar9 = sf::VertexArray::operator[](this_00,index);
            (pVVar9->position).x = fVar23;
            (pVVar9->position).y = fVar22;
            pVVar9 = sf::VertexArray::operator[](this_00,index);
            pVVar9->color = CVar20;
            pVVar9 = sf::VertexArray::operator[](this_00,(ulong)(iVar19 + 1));
            (pVVar9->position).x = fVar23 + 1024.0;
            (pVVar9->position).y = fVar22;
            pVVar9 = sf::VertexArray::operator[](this_00,(ulong)(iVar19 + 1));
            pVVar9->color = CVar20;
            pVVar9 = sf::VertexArray::operator[](this_00,(ulong)(iVar19 + 2));
            (pVVar9->position).x = fVar23;
            (pVVar9->position).y = fVar22;
            pVVar9 = sf::VertexArray::operator[](this_00,(ulong)(iVar19 + 2));
            pVVar9->color = CVar20;
            pVVar9 = sf::VertexArray::operator[](this_00,(ulong)(iVar19 + 3));
            (pVVar9->position).x = fVar23;
            (pVVar9->position).y = fVar22 + 1024.0;
            pVVar9 = sf::VertexArray::operator[](this_00,(ulong)(iVar19 + 3));
            pVVar9->color = CVar20;
            index = (size_t)(iVar19 + 4);
            iVar13 = iVar13 + 1;
          } while (iVar13 < (this->lastVisibleArea_).width);
          iVar6 = (this->lastVisibleArea_).height;
        }
        iVar11 = iVar11 + 1;
      } while (iVar11 < iVar6);
    }
    sf::RenderTarget::draw(local_a8,&this_00->super_Drawable,&states);
  }
  pDVar7 = DebugScreen::instance();
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c8,"Board::draw draw_debug_done","");
  DebugScreen::profilerEvent(pDVar7,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Board::draw(sf::RenderTarget& target, sf::RenderStates states) const {
    target.draw(chunkRenderCache_[getLevelOfDetail()], states);

    sf::RenderStates states2 = states;
    states2.transform.translate(static_cast<sf::Vector2f>(
        sf::Vector2i(
            lastVisibleArea_.left - ChunkCoords::x(lastTopLeft_),
            lastVisibleArea_.top - ChunkCoords::y(lastTopLeft_)
        ) * Chunk::WIDTH * static_cast<int>(TileWidth::TEXELS)
    ));
    drawDecorations(target, states2, lastVisibleArea_);

    DebugScreen::instance()->profilerEvent("Board::draw draw_debug");
    if (debugDrawChunkBorder_ && lastVisibleArea_.width > 0 && lastVisibleArea_.height > 0) {
        debugChunkBorder_.resize(lastVisibleArea_.width * lastVisibleArea_.height * 4);
        constexpr int chunkWidthTexels = Chunk::WIDTH * static_cast<int>(TileWidth::TEXELS);
        const sf::Vector2i positionOffset = {
            lastVisibleArea_.left - ChunkCoords::x(lastTopLeft_),
            lastVisibleArea_.top - ChunkCoords::y(lastTopLeft_)
        };

        unsigned int i = 0;
        for (int y = 0; y < lastVisibleArea_.height; ++y) {
            auto chunkDrawable = chunkDrawables_.upper_bound(ChunkCoords::pack(lastVisibleArea_.left - 1, lastVisibleArea_.top + y));
            float yChunkPos = static_cast<float>((y + positionOffset.y) * chunkWidthTexels);
            for (int x = 0; x < lastVisibleArea_.width; ++x) {
                float xChunkPos = static_cast<float>((x + positionOffset.x) * chunkWidthTexels);
                sf::Color borderColor = sf::Color::Blue;
                if (chunkDrawable != chunkDrawables_.end() && chunkDrawable->first == ChunkCoords::pack(lastVisibleArea_.left + x, lastVisibleArea_.top + y)) {
                    if (chunkDrawable->second.getChunk() != nullptr) {
                        borderColor = (chunkDrawable->second.getChunk()->isUnsaved() ? sf::Color(255, 127, 0) : sf::Color::Yellow);
                    } else {
                        borderColor = sf::Color::Cyan;
                    }
                    ++chunkDrawable;
                }

                debugChunkBorder_[i + 0].position = {xChunkPos, yChunkPos};
                debugChunkBorder_[i + 0].color = borderColor;
                debugChunkBorder_[i + 1].position = {xChunkPos + chunkWidthTexels, yChunkPos};
                debugChunkBorder_[i + 1].color = borderColor;
                debugChunkBorder_[i + 2].position = {xChunkPos, yChunkPos};
                debugChunkBorder_[i + 2].color = borderColor;
                debugChunkBorder_[i + 3].position = {xChunkPos, yChunkPos + chunkWidthTexels};
                debugChunkBorder_[i + 3].color = borderColor;
                i += 4;
            }
        }
        target.draw(debugChunkBorder_, states);
    }
    DebugScreen::instance()->profilerEvent("Board::draw draw_debug_done");
}